

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::TfLow(AbstractContentContext *this,string *inFontName,double inFontSize)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  GraphicState *pGVar2;
  allocator<char> local_49;
  double local_48;
  string local_40;
  
  local_48 = inFontSize;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteName(this_00,inFontName,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_48,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Tf",&local_49);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pGVar2 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  std::__cxx11::string::_M_assign((string *)&pGVar2->mPlacedFontName);
  pGVar2 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  pGVar2->mPlacedFontSize = local_48;
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::TfLow(const std::string& inFontName,double inFontSize)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteName(inFontName);
	mPrimitiveWriter.WriteDouble(inFontSize);
	mPrimitiveWriter.WriteKeyword("Tf");

	mGraphicStack.GetCurrentState().mPlacedFontName = inFontName;
	mGraphicStack.GetCurrentState().mPlacedFontSize = inFontSize;
	return GetCurrentStatusCode();
}